

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O1

void png_write_chunk_data(png_structrp png_ptr,png_const_bytep data,size_t length)

{
  if (length != 0 && (data != (png_const_bytep)0x0 && png_ptr != (png_structrp)0x0)) {
    png_write_data(png_ptr,data,length);
    png_calculate_crc(png_ptr,data,length);
    return;
  }
  return;
}

Assistant:

void PNGAPI
png_write_chunk_data(png_structrp png_ptr, png_const_bytep data, size_t length)
{
   /* Write the data, and run the CRC over it */
   if (png_ptr == NULL)
      return;

   if (data != NULL && length > 0)
   {
      png_write_data(png_ptr, data, length);

      /* Update the CRC after writing the data,
       * in case the user I/O routine alters it.
       */
      png_calculate_crc(png_ptr, data, length);
   }
}